

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoderTests.cpp
# Opt level: O2

int testOneHotEncoderBasic(void)

{
  shared_ptr<CoreML::Specification::Model> *this;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  allocator<char> local_91;
  undefined1 local_90 [40];
  undefined1 local_68 [32];
  FeatureType local_48;
  FeatureType local_38;
  OneHotEncoder ohe;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"",(allocator<char> *)local_68);
  CoreML::OneHotEncoder::OneHotEncoder(&ohe,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"",&local_91);
  CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)local_68,(string *)local_90);
  this = &ohe.super_Model.m_spec;
  std::__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this->super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2> *)
             (local_68 + 8));
  CoreML::Model::~Model((Model *)local_68);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"Int64",&local_91);
  CoreML::FeatureType::Int64();
  CoreML::OneHotEncoder::addInput((Result *)local_90,&ohe,(string *)local_68,&local_38);
  bVar1 = CoreML::Result::good((Result *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_type.
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_68);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"",&local_91);
    CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)local_68,(string *)local_90);
    std::__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this->super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2> *)
               (local_68 + 8));
    CoreML::Model::~Model((Model *)local_68);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"String",&local_91);
    CoreML::FeatureType::String();
    CoreML::OneHotEncoder::addInput((Result *)local_90,&ohe,(string *)local_68,&local_48);
    bVar1 = CoreML::Result::good((Result *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.m_type.
                super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_68);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"",&local_91);
      CoreML::OneHotEncoder::OneHotEncoder((OneHotEncoder *)local_68,(string *)local_90);
      std::__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this->super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2> *)
                  (local_68 + 8));
      CoreML::Model::~Model((Model *)local_68);
      std::__cxx11::string::~string((string *)local_90);
      iVar3 = 0;
      goto LAB_00161414;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/OneHotEncoderTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x17);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(ohe.addInput(\"String\", FeatureType::String())).good()";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/OneHotEncoderTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x14);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(ohe.addInput(\"Int64\", FeatureType::Int64())).good()";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 1;
LAB_00161414:
  CoreML::Model::~Model(&ohe.super_Model);
  return iVar3;
}

Assistant:

int testOneHotEncoderBasic() {
    OneHotEncoder ohe;

    /* Asserts that the type provided is allowed as a feature type by a new
     one hot encoder appended to a model asset named "a". */
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("Int64", FeatureType::Int64()));

    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("String", FeatureType::String()));

    /* Asserts that the type provided is not allowed as a feature type by a new
     one hot encoder. */
    ohe = OneHotEncoder();

    /*
    Result r;
    ML_ASSERT_GOOD(r = ohe.addInput("Double", FeatureType::Double()));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    
    r = ohe.addInput("Image", FeatureType::Image());
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    
    r = ohe.addInput("Array", FeatureType::Array({2,3}));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
                     
    r = ohe.addInput("Dictionary", FeatureType::Dictionary(MLTypeInt64));
    ML_ASSERT_EQ(r.type(), ResultType::FEATURE_TYPE_INVARIANT_VIOLATION);
    */
    
    /* Asserts that the TYPE provided is generally allowed as a feature type by a
     new one hot encoder, but has a type mismatch if that one hot encoder is added
     to the existing model asset "a". */
    /*
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("String", FeatureType::String()));
    */

    /* however, this one should still work, since it doesn't modify the type
     * (since the underlying data is already in one-hot encoding, it's probably
     * a no-op, but that's a decision for the execution engine and not the model
     * serialization -- at this point in time, it's moot, as long as the types
     * match). */
    /*
    ohe = OneHotEncoder();
    ML_ASSERT_GOOD(ohe.addInput("Int64", FeatureType::Int64()));
    */

    return 0;
}